

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_error.hpp
# Opt level: O0

void __thiscall jsoncons::jsonpath::jsonpath_error::what(jsonpath_error *this)

{
  jsonpath_error *in_stack_00000098;
  
  what(in_stack_00000098);
  return;
}

Assistant:

const char* what() const noexcept override
        {
            if (what_.empty())
            {
                JSONCONS_TRY
                {
                    what_.append(std::system_error::what());
                    if (line_number_ != 0 && column_number_ != 0)
                    {
                        what_.append(" at line ");
                        what_.append(std::to_string(line_number_));
                        what_.append(" and column ");
                        what_.append(std::to_string(column_number_));
                    }
                    else if (column_number_ != 0)
                    {
                        what_.append(" at position ");
                        what_.append(std::to_string(column_number_));
                    }
                    return what_.c_str();
                }
                JSONCONS_CATCH(...)
                {
                    return std::system_error::what();
                }
            }